

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ay_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Ay_Emu::run_clocks(Ay_Emu *this,blip_time_t *duration,int param_3)

{
  ushort uVar1;
  uint uVar2;
  time_t tVar3;
  int iVar4;
  int *in_RSI;
  time_t *__timer;
  long in_RDI;
  uint addr;
  cpu_time_t in_stack_000001cc;
  Ay_Cpu *in_stack_000001d0;
  blip_time_t in_stack_ffffffffffffffcc;
  Ay_Apu *in_stack_ffffffffffffffd0;
  
  __timer = (time_t *)0x0;
  Ay_Cpu::set_time((Ay_Cpu *)(in_RDI + 0x1c8),0);
  if ((*(byte *)(in_RDI + 0x440) & 1) == 0 && (*(byte *)(in_RDI + 0x441) & 1) == 0) {
    *in_RSI = *in_RSI / 2;
  }
  while (tVar3 = Ay_Cpu::time((Ay_Cpu *)(in_RDI + 0x1c8),__timer), (int)tVar3 < *in_RSI) {
    in_stack_ffffffffffffffd0 = (Ay_Apu *)(in_RDI + 0x1c8);
    uVar2 = ::min(*in_RSI,*(int *)(in_RDI + 0x424));
    __timer = (time_t *)(ulong)uVar2;
    Ay_Cpu::run(in_stack_000001d0,in_stack_000001cc);
    tVar3 = Ay_Cpu::time((Ay_Cpu *)(in_RDI + 0x1c8),__timer);
    if ((*(int *)(in_RDI + 0x424) <= (int)tVar3) &&
       (*(int *)(in_RDI + 0x424) = *(int *)(in_RDI + 0x420) + *(int *)(in_RDI + 0x424),
       *(char *)(in_RDI + 0x400) != '\0')) {
      if (*(char *)(in_RDI + 0x542 + (ulong)*(ushort *)(in_RDI + 1000)) == 'v') {
        *(short *)(in_RDI + 1000) = *(short *)(in_RDI + 1000) + 1;
      }
      *(undefined1 *)(in_RDI + 0x401) = 0;
      *(undefined1 *)(in_RDI + 0x400) = 0;
      uVar1 = *(short *)(in_RDI + 0x3ea) - 1;
      *(ushort *)(in_RDI + 0x3ea) = uVar1;
      *(char *)(in_RDI + 0x542 + (ulong)uVar1) = (char)((ushort)*(undefined2 *)(in_RDI + 1000) >> 8)
      ;
      uVar1 = *(short *)(in_RDI + 0x3ea) - 1;
      *(ushort *)(in_RDI + 0x3ea) = uVar1;
      *(char *)(in_RDI + 0x542 + (ulong)uVar1) = (char)*(undefined2 *)(in_RDI + 1000);
      *(undefined2 *)(in_RDI + 1000) = 0x38;
      __timer = (time_t *)0xc;
      Ay_Cpu::adjust_time((Ay_Cpu *)(in_RDI + 0x1c8),0xc);
      if (*(char *)(in_RDI + 0x404) == '\x02') {
        __timer = (time_t *)0x6;
        Ay_Cpu::adjust_time((Ay_Cpu *)(in_RDI + 0x1c8),6);
        iVar4 = (uint)*(byte *)(in_RDI + 0x403) * 0x100;
        *(ushort *)(in_RDI + 1000) =
             (ushort)*(byte *)(in_RDI + 0x542 + (ulong)(iVar4 + 0x100U & 0xffff)) * 0x100 +
             (ushort)*(byte *)(in_RDI + 0x542 + (ulong)(iVar4 + 0xff));
      }
    }
  }
  tVar3 = Ay_Cpu::time((Ay_Cpu *)(in_RDI + 0x1c8),__timer);
  *in_RSI = (int)tVar3;
  *(int *)(in_RDI + 0x424) = *(int *)(in_RDI + 0x424) - *in_RSI;
  Ay_Cpu::adjust_time((Ay_Cpu *)(in_RDI + 0x1c8),-*in_RSI);
  Ay_Apu::end_frame(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Ay_Emu::run_clocks( blip_time_t& duration, int )
{
	set_time( 0 );
	if ( !(spectrum_mode | cpc_mode) )
		duration /= 2; // until mode is set, leave room for halved clock rate
	
	while ( time() < duration )
	{
		cpu::run( min( duration, (blip_time_t) next_play ) );
		
		if ( time() >= next_play )
		{
			next_play += play_period;
			
			if ( r.iff1 )
			{
				if ( mem.ram [r.pc] == 0x76 )
					r.pc++;
				
				r.iff1 = r.iff2 = 0;
				
				mem.ram [--r.sp] = uint8_t (r.pc >> 8);
				mem.ram [--r.sp] = uint8_t (r.pc);
				r.pc = 0x38;
				cpu::adjust_time( 12 );
				if ( r.im == 2 )
				{
					cpu::adjust_time( 6 );
					unsigned addr = r.i * 0x100u + 0xFF;
					r.pc = mem.ram [(addr + 1) & 0xFFFF] * 0x100u + mem.ram [addr];
				}
			}
		}
	}
	duration = time();
	next_play -= duration;
	check( next_play >= 0 );
	adjust_time( -duration );
	
	apu.end_frame( duration );
	
	return 0;
}